

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdecode.c
# Opt level: O0

FT_Int cff_compute_bias(FT_Int in_charstring_type,FT_UInt num_subrs)

{
  undefined4 local_14;
  FT_Int result;
  FT_UInt num_subrs_local;
  FT_Int in_charstring_type_local;
  
  if (in_charstring_type == 1) {
    local_14 = 0;
  }
  else if (num_subrs < 0x4d8) {
    local_14 = 0x6b;
  }
  else if (num_subrs < 0x846c) {
    local_14 = 0x46b;
  }
  else {
    local_14 = 0x8000;
  }
  return local_14;
}

Assistant:

static FT_Int
  cff_compute_bias( FT_Int   in_charstring_type,
                    FT_UInt  num_subrs )
  {
    FT_Int  result;


    if ( in_charstring_type == 1 )
      result = 0;
    else if ( num_subrs < 1240 )
      result = 107;
    else if ( num_subrs < 33900U )
      result = 1131;
    else
      result = 32768U;

    return result;
  }